

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageWrite(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t id;
  Op OVar2;
  spv_result_t sVar3;
  DiagnosticStream *pDVar4;
  spv_const_context psVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  size_type sVar6;
  undefined1 local_12d8 [4];
  spv_result_t result_1;
  DiagnosticStream local_1100;
  DiagnosticStream local_f28;
  uint32_t local_d4c;
  undefined1 local_d48 [4];
  uint32_t texel_component_type;
  uint32_t local_b6c;
  undefined1 local_b68 [4];
  uint32_t texel_type;
  uint32_t local_990;
  uint local_98c;
  uint32_t actual_coord_size;
  uint32_t min_coord_size;
  uint32_t local_7b0;
  spv_result_t local_7ac;
  uint32_t coord_type;
  spv_result_t result;
  DiagnosticStream local_5d0;
  DiagnosticStream local_3f8;
  undefined1 local_220 [8];
  ImageTypeInfo info;
  uint32_t image_type;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  id = ValidationState_t::GetOperandTypeId(_,inst,0);
  OVar2 = ValidationState_t::GetIdOpcode(_,id);
  if (OVar2 == OpTypeImage) {
    ImageTypeInfo::ImageTypeInfo((ImageTypeInfo *)local_220);
    bVar1 = GetImageTypeInfo(_,id,(ImageTypeInfo *)local_220);
    if (bVar1) {
      if (local_220._4_4_ == DimSubpassData) {
        ValidationState_t::diag(&local_5d0,_,SPV_ERROR_INVALID_DATA,inst);
        pDVar4 = DiagnosticStream::operator<<
                           (&local_5d0,(char (*) [34])"Image \'Dim\' cannot be SubpassData");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_5d0);
      }
      else if (local_220._4_4_ == TileImageDataEXT) {
        ValidationState_t::diag((DiagnosticStream *)&coord_type,_,SPV_ERROR_INVALID_DATA,inst);
        pDVar4 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)&coord_type,
                            (char (*) [39])"Image \'Dim\' cannot be TileImageDataEXT");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&coord_type);
      }
      else {
        local_7ac = ValidateImageReadWrite(_,inst,(ImageTypeInfo *)local_220);
        __local._4_4_ = local_7ac;
        if (local_7ac == SPV_SUCCESS) {
          local_7b0 = ValidationState_t::GetOperandTypeId(_,inst,1);
          bVar1 = ValidationState_t::IsIntScalarOrVectorType(_,local_7b0);
          if (bVar1) {
            OVar2 = Instruction::opcode(inst);
            local_98c = GetMinCoordSize(OVar2,(ImageTypeInfo *)local_220);
            local_990 = ValidationState_t::GetDimension(_,local_7b0);
            if (local_990 < local_98c) {
              ValidationState_t::diag((DiagnosticStream *)local_b68,_,SPV_ERROR_INVALID_DATA,inst);
              pDVar4 = DiagnosticStream::operator<<
                                 ((DiagnosticStream *)local_b68,
                                  (char (*) [38])"Expected Coordinate to have at least ");
              pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_98c);
              pDVar4 = DiagnosticStream::operator<<
                                 (pDVar4,(char (*) [29])" components, but given only ");
              pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_990);
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_b68);
            }
            else {
              local_b6c = ValidationState_t::GetOperandTypeId(_,inst,2);
              bVar1 = ValidationState_t::IsIntScalarOrVectorType(_,local_b6c);
              if ((bVar1) ||
                 (bVar1 = ValidationState_t::IsFloatScalarOrVectorType(_,local_b6c), bVar1)) {
                OVar2 = ValidationState_t::GetIdOpcode(_,local_220._0_4_);
                if ((OVar2 == OpTypeVoid) ||
                   (local_d4c = ValidationState_t::GetComponentType(_,local_b6c),
                   local_d4c == local_220._0_4_)) {
                  psVar5 = ValidationState_t::context(_);
                  bVar1 = spvIsVulkanEnv(psVar5->target_env);
                  if ((((!bVar1) || (info.multisampled != 0)) || (local_220._4_4_ == DimSubpassData)
                      ) || (bVar1 = ValidationState_t::HasCapability
                                              (_,CapabilityStorageImageWriteWithoutFormat), bVar1))
                  {
                    this = Instruction::words(inst);
                    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this);
                    if (4 < sVar6) {
                      psVar5 = ValidationState_t::context(_);
                      bVar1 = spvIsOpenCLEnv(psVar5->target_env);
                      if (bVar1) {
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_12d8,_,SPV_ERROR_INVALID_DATA,inst);
                        pDVar4 = DiagnosticStream::operator<<
                                           ((DiagnosticStream *)local_12d8,
                                            (char (*) [55])
                                            "Optional Image Operands are not allowed in the OpenCL "
                                           );
                        pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [13])0x63c743);
                        sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
                        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_12d8);
                        return sVar3;
                      }
                    }
                    __local._4_4_ = ValidateImageOperands(_,inst,(ImageTypeInfo *)local_220,5);
                    if (__local._4_4_ == SPV_SUCCESS) {
                      __local._4_4_ = SPV_SUCCESS;
                    }
                  }
                  else {
                    ValidationState_t::diag(&local_1100,_,SPV_ERROR_INVALID_DATA,inst);
                    pDVar4 = DiagnosticStream::operator<<
                                       (&local_1100,
                                        (char (*) [64])
                                        "Capability StorageImageWriteWithoutFormat is required to write "
                                       );
                    pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [17])"to storage image");
                    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
                    DiagnosticStream::~DiagnosticStream(&local_1100);
                  }
                }
                else {
                  ValidationState_t::diag(&local_f28,_,SPV_ERROR_INVALID_DATA,inst);
                  pDVar4 = DiagnosticStream::operator<<
                                     (&local_f28,
                                      (char (*) [55])
                                      "Expected Image \'Sampled Type\' to be the same as Texel ");
                  pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [11])0x63e860);
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
                  DiagnosticStream::~DiagnosticStream(&local_f28);
                }
              }
              else {
                ValidationState_t::diag((DiagnosticStream *)local_d48,_,SPV_ERROR_INVALID_DATA,inst)
                ;
                pDVar4 = DiagnosticStream::operator<<
                                   ((DiagnosticStream *)local_d48,
                                    (char (*) [51])
                                    "Expected Texel to be int or float vector or scalar");
                __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_d48);
              }
            }
          }
          else {
            ValidationState_t::diag
                      ((DiagnosticStream *)&actual_coord_size,_,SPV_ERROR_INVALID_DATA,inst);
            pDVar4 = DiagnosticStream::operator<<
                               ((DiagnosticStream *)&actual_coord_size,
                                (char (*) [47])"Expected Coordinate to be int scalar or vector");
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&actual_coord_size);
          }
        }
      }
    }
    else {
      ValidationState_t::diag(&local_3f8,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_3f8,(char (*) [30])"Corrupt image type definition");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_3f8);
    }
  }
  else {
    ValidationState_t::diag((DiagnosticStream *)&info.format,_,SPV_ERROR_INVALID_DATA,inst);
    pDVar4 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&info.format,
                        (char (*) [41])"Expected Image to be of type OpTypeImage");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&info.format);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateImageWrite(ValidationState_t& _, const Instruction* inst) {
  const uint32_t image_type = _.GetOperandTypeId(inst, 0);
  if (_.GetIdOpcode(image_type) != spv::Op::OpTypeImage) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Image to be of type OpTypeImage";
  }

  ImageTypeInfo info;
  if (!GetImageTypeInfo(_, image_type, &info)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Corrupt image type definition";
  }

  if (info.dim == spv::Dim::SubpassData) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Image 'Dim' cannot be SubpassData";
  }

  if (info.dim == spv::Dim::TileImageDataEXT) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Image 'Dim' cannot be TileImageDataEXT";
  }

  if (spv_result_t result = ValidateImageReadWrite(_, inst, info))
    return result;

  const uint32_t coord_type = _.GetOperandTypeId(inst, 1);
  if (!_.IsIntScalarOrVectorType(coord_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Coordinate to be int scalar or vector";
  }

  const uint32_t min_coord_size = GetMinCoordSize(inst->opcode(), info);
  const uint32_t actual_coord_size = _.GetDimension(coord_type);
  if (min_coord_size > actual_coord_size) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Coordinate to have at least " << min_coord_size
           << " components, but given only " << actual_coord_size;
  }

  // because it needs to match with 'Sampled Type' the Texel can't be a boolean
  const uint32_t texel_type = _.GetOperandTypeId(inst, 2);
  if (!_.IsIntScalarOrVectorType(texel_type) &&
      !_.IsFloatScalarOrVectorType(texel_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Texel to be int or float vector or scalar";
  }

  if (_.GetIdOpcode(info.sampled_type) != spv::Op::OpTypeVoid) {
    const uint32_t texel_component_type = _.GetComponentType(texel_type);
    if (texel_component_type != info.sampled_type) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image 'Sampled Type' to be the same as Texel "
             << "components";
    }
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (info.format == spv::ImageFormat::Unknown &&
        info.dim != spv::Dim::SubpassData &&
        !_.HasCapability(spv::Capability::StorageImageWriteWithoutFormat)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Capability StorageImageWriteWithoutFormat is required to "
                "write "
             << "to storage image";
    }
  }

  if (inst->words().size() > 4) {
    if (spvIsOpenCLEnv(_.context()->target_env)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Optional Image Operands are not allowed in the OpenCL "
             << "environment.";
    }
  }

  if (spv_result_t result =
          ValidateImageOperands(_, inst, info, /* word_index = */ 5))
    return result;

  return SPV_SUCCESS;
}